

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store(XMLWriter *this,QuadLight *light,ssize_t id)

{
  vfloat4 a0;
  string asStack_98 [32];
  string local_78 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  std::__cxx11::string::string(local_78,"QuadLight",(allocator *)&local_58.field_1);
  open(this,(char *)local_78,(int)id);
  std::__cxx11::string::~string(local_78);
  local_48 = (light->v0).field_0.m128[0];
  fStack_44 = (light->v0).field_0.m128[1];
  fStack_40 = (light->v0).field_0.m128[2];
  fStack_3c = (light->v0).field_0.m128[3];
  local_28 = *(undefined8 *)&(light->v2).field_0;
  uStack_20 = *(undefined8 *)((long)&(light->v2).field_0 + 8);
  local_58.m128[0] = (light->v3).field_0.m128[0] - local_48;
  local_58.m128[1] = (light->v3).field_0.m128[1] - fStack_44;
  local_58.m128[2] = (light->v3).field_0.m128[2] - fStack_40;
  local_58.m128[3] = (light->v3).field_0.m128[3] - fStack_3c;
  local_48 = (light->v1).field_0.m128[0] - local_48;
  fStack_44 = (light->v1).field_0.m128[1] - fStack_44;
  fStack_40 = (light->v1).field_0.m128[2] - fStack_40;
  fStack_3c = (light->v1).field_0.m128[3] - fStack_3c;
  fStack_30 = fStack_44 * local_58.m128[0] - local_58.m128[1] * local_48;
  local_38 = fStack_40 * local_58.m128[1] - local_58.m128[2] * fStack_44;
  fStack_34 = local_48 * local_58.m128[2] - local_58.m128[0] * fStack_40;
  fStack_2c = fStack_3c * local_58.m128[3] - local_58.m128[3] * fStack_3c;
  store(this,"AffineSpace",(AffineSpace3fa *)&local_58.field_1);
  store(this,"L",&light->L);
  std::__cxx11::string::string(asStack_98,"QuadLight",(allocator *)&local_58.field_1);
  close(this,(int)asStack_98);
  std::__cxx11::string::~string(asStack_98);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::QuadLight& light, ssize_t id)
  {
    open("QuadLight",id);
    const Vec3fa dx = light.v3-light.v0;
    const Vec3fa dy = light.v1-light.v0;
    const Vec3fa dz = cross(dx,dy);
    const Vec3fa p = light.v2;
    store("AffineSpace",AffineSpace3fa(dx,dy,dz,p));
    store("L",light.L);
    close("QuadLight");
  }